

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zeDeviceGetRootDevice(ze_device_handle_t hDevice,ze_device_handle_t *phRootDevice)

{
  ze_result_t zVar1;
  
  if (DAT_0010e248 != (code *)0x0) {
    zVar1 = (*DAT_0010e248)();
    return zVar1;
  }
  context_t::get()::count = (ze_device_handle_t)((long)context_t::get()::count + 1);
  *phRootDevice = context_t::get()::count;
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetRootDevice(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device object
        ze_device_handle_t* phRootDevice                ///< [in,out] parent root device.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetRootDevice = context.zeDdiTable.Device.pfnGetRootDevice;
        if( nullptr != pfnGetRootDevice )
        {
            result = pfnGetRootDevice( hDevice, phRootDevice );
        }
        else
        {
            // generic implementation
            *phRootDevice = reinterpret_cast<ze_device_handle_t>( context.get() );

        }

        return result;
    }